

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_reflect.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerReflection::emit_type
          (CompilerReflection *this,uint32_t type_id,bool *emitted_open_tag)

{
  Stream *pSVar1;
  ulong uVar2;
  bool bVar3;
  uint32_t value;
  SPIRType *type;
  uint32_t i;
  ulong uVar4;
  allocator local_a9;
  string local_a8;
  string local_88;
  string local_68;
  string name;
  
  type = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,type_id);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&name,this,type,0);
  if (*emitted_open_tag == false) {
    pSVar1 = (this->json_stream).super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    ::std::__cxx11::string::string((string *)&local_a8,"types",(allocator *)&local_88);
    simple_json::Stream::emit_json_key_object(pSVar1,&local_a8);
    ::std::__cxx11::string::~string((string *)&local_a8);
    *emitted_open_tag = true;
  }
  pSVar1 = (this->json_stream).super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  ::std::__cxx11::to_string(&local_88,type_id);
  ::std::operator+(&local_a8,"_",&local_88);
  simple_json::Stream::emit_json_key_object(pSVar1,&local_a8);
  ::std::__cxx11::string::~string((string *)&local_a8);
  ::std::__cxx11::string::~string((string *)&local_88);
  pSVar1 = (this->json_stream).super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  ::std::__cxx11::string::string((string *)&local_a8,"name",(allocator *)&local_88);
  simple_json::Stream::emit_json_key_value(pSVar1,&local_a8,&name);
  ::std::__cxx11::string::~string((string *)&local_a8);
  bVar3 = Compiler::is_physical_pointer((Compiler *)this,type);
  if (bVar3) {
    pSVar1 = (this->json_stream).super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    ::std::__cxx11::string::string((string *)&local_a8,"type",&local_a9);
    ::std::__cxx11::to_string(&local_68,(type->parent_type).id);
    ::std::operator+(&local_88,"_",&local_68);
    simple_json::Stream::emit_json_key_value(pSVar1,&local_a8,&local_88);
    ::std::__cxx11::string::~string((string *)&local_88);
    ::std::__cxx11::string::~string((string *)&local_68);
    ::std::__cxx11::string::~string((string *)&local_a8);
    pSVar1 = (this->json_stream).super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    ::std::__cxx11::string::string((string *)&local_a8,"physical_pointer",(allocator *)&local_88);
    simple_json::Stream::emit_json_key_value(pSVar1,&local_a8,true);
  }
  else {
    if ((type->array).super_VectorView<unsigned_int>.buffer_size == 0) {
      pSVar1 = (this->json_stream).
               super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      ::std::__cxx11::string::string((string *)&local_a8,"members",(allocator *)&local_88);
      simple_json::Stream::emit_json_key_array(pSVar1,&local_a8);
      ::std::__cxx11::string::~string((string *)&local_a8);
      uVar2 = (type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
              buffer_size;
      for (uVar4 = 0; uVar4 < uVar2; uVar4 = (ulong)((uint32_t)uVar4 + 1)) {
        emit_type_member(this,type,(uint32_t)uVar4);
      }
      simple_json::Stream::end_json_array
                ((this->json_stream).
                 super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      goto LAB_001bdd72;
    }
    emit_type_array(this,type);
    pSVar1 = (this->json_stream).super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    ::std::__cxx11::string::string((string *)&local_a8,"type",&local_a9);
    ::std::__cxx11::to_string(&local_68,(type->parent_type).id);
    ::std::operator+(&local_88,"_",&local_68);
    simple_json::Stream::emit_json_key_value(pSVar1,&local_a8,&local_88);
    ::std::__cxx11::string::~string((string *)&local_88);
    ::std::__cxx11::string::~string((string *)&local_68);
    ::std::__cxx11::string::~string((string *)&local_a8);
    pSVar1 = (this->json_stream).super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    ::std::__cxx11::string::string((string *)&local_a8,"array_stride",(allocator *)&local_88);
    value = Compiler::get_decoration((Compiler *)this,(ID)type_id,DecorationArrayStride);
    simple_json::Stream::emit_json_key_value(pSVar1,&local_a8,value);
  }
  ::std::__cxx11::string::~string((string *)&local_a8);
LAB_001bdd72:
  simple_json::Stream::end_json_object
            ((this->json_stream).super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr);
  ::std::__cxx11::string::~string((string *)&name);
  return;
}

Assistant:

void CompilerReflection::emit_type(uint32_t type_id, bool &emitted_open_tag)
{
	auto &type = get<SPIRType>(type_id);
	auto name = type_to_glsl(type);

	if (!emitted_open_tag)
	{
		json_stream->emit_json_key_object("types");
		emitted_open_tag = true;
	}
	json_stream->emit_json_key_object("_" + std::to_string(type_id));
	json_stream->emit_json_key_value("name", name);

	if (is_physical_pointer(type))
	{
		json_stream->emit_json_key_value("type", "_" + std::to_string(type.parent_type));
		json_stream->emit_json_key_value("physical_pointer", true);
	}
	else if (!type.array.empty())
	{
		emit_type_array(type);
		json_stream->emit_json_key_value("type", "_" + std::to_string(type.parent_type));
		json_stream->emit_json_key_value("array_stride", get_decoration(type_id, DecorationArrayStride));
	}
	else
	{
		json_stream->emit_json_key_array("members");
		// FIXME ideally we'd like to emit the size of a structure as a
		// convenience to people parsing the reflected JSON.  The problem
		// is that there's no implicit size for a type.  It's final size
		// will be determined by the top level declaration in which it's
		// included.  So there might be one size for the struct if it's
		// included in a std140 uniform block and another if it's included
		// in a std430 uniform block.
		// The solution is to include *all* potential sizes as a map of
		// layout type name to integer, but that will probably require
		// some additional logic being written in this class, or in the
		// parent CompilerGLSL class.
		auto size = type.member_types.size();
		for (uint32_t i = 0; i < size; ++i)
		{
			emit_type_member(type, i);
		}
		json_stream->end_json_array();
	}

	json_stream->end_json_object();
}